

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

void __thiscall
Lib::DHMap<unsigned_int,_Lib::DArray<signed_char>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
          (DHMap<unsigned_int,_Lib::DArray<signed_char>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           *this)

{
  if (this->_entries != (Entry *)0x0) {
    Lib::free(this->_entries);
  }
  return;
}

Assistant:

~DHMap()
  {
    if(_entries) {
      ASS_EQ(_afterLast-_entries,_capacity);
      array_delete(_entries, _capacity);
      DEALLOC_KNOWN(_entries,_capacity*sizeof(Entry),"DHMap::Entry");
    }
  }